

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

char * FIX::socket_hostname(char *name)

{
  in_addr_t iVar1;
  hostent *host_ptr;
  int error;
  hostent host;
  char buf [1024];
  hostent *local_448;
  int local_43c;
  hostent local_438;
  char local_418 [1032];
  
  local_448 = (hostent *)0x0;
  iVar1 = inet_addr(name);
  if (iVar1 == 0xffffffff) {
    gethostbyname_r(name,&local_438,local_418,0x400,&local_448,&local_43c);
    if (local_448 == (hostent *)0x0) {
      name = (char *)0x0;
    }
    else {
      name = inet_ntoa((in_addr)*(in_addr_t *)*local_448->h_addr_list);
    }
  }
  return name;
}

Assistant:

const char *socket_hostname(const char *name) {
  struct hostent *host_ptr = 0;
  struct in_addr **paddr;
  struct in_addr saddr;

#if (GETHOSTBYNAME_R_INPUTS_RESULT || GETHOSTBYNAME_R_RETURNS_RESULT)
  hostent host;
  char buf[1024];
  int error;
#endif

  saddr.s_addr = inet_addr(name);
  if (saddr.s_addr != (unsigned)-1) {
    return name;
  }

#if GETHOSTBYNAME_R_INPUTS_RESULT
  gethostbyname_r(name, &host, buf, sizeof(buf), &host_ptr, &error);
#elif GETHOSTBYNAME_R_RETURNS_RESULT
  host_ptr = gethostbyname_r(name, &host, buf, sizeof(buf), &error);
#else
  host_ptr = gethostbyname(name);
#endif

  if (host_ptr == 0) {
    return 0;
  }

  paddr = (struct in_addr **)host_ptr->h_addr_list;
  return inet_ntoa(**paddr);
}